

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::tryExpandData
          (Group *this,uint oldLgSize,uint oldOffset,uint expansionFactor)

{
  DataLocationUsage *pDVar1;
  DataLocation *pDVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  Fault f;
  
  if ((expansionFactor + oldLgSize < 7) &&
     ((~(-1 << ((byte)expansionFactor & 0x1f)) & oldOffset) == 0)) {
    bVar8 = 0;
  }
  else {
    bVar8 = 1;
    bVar3 = shouldDetectIssue344();
    if (!bVar3) {
      return false;
    }
  }
  pDVar1 = (this->parentDataLocationUsage).builder.ptr;
  uVar5 = 0;
  do {
    uVar6 = (ulong)uVar5;
    if ((ulong)((long)(this->parentDataLocationUsage).builder.pos - (long)pDVar1 >> 3) <= uVar6) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x238,FAILED,(char *)0x0,"\"Tried to expand field that was never allocated.\"",
                 (char (*) [48])"Tried to expand field that was never allocated.");
      kj::_::Debug::Fault::fatal(&f);
    }
    pDVar2 = (this->parent->dataLocations).builder.ptr;
    uVar7 = pDVar2[uVar6].lgSize;
    bVar4 = (char)uVar7 - (char)oldLgSize;
    if (oldLgSize <= uVar7) {
      uVar7 = oldOffset >> (bVar4 & 0x1f);
      pDVar2 = pDVar2 + uVar6;
      if (uVar7 == pDVar2->offset) {
        bVar3 = DataLocationUsage::tryExpand
                          (pDVar1 + uVar6,this,pDVar2,oldLgSize,
                           oldOffset - (uVar7 << (bVar4 & 0x1f)),expansionFactor);
        if ((bVar8 & bVar3) != 1) {
          return bVar3;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[177]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x232,FAILED,(char *)0x0,
                   "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344\""
                   ,(char (*) [177])
                    "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344"
                  );
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool tryExpandData(uint oldLgSize, uint oldOffset, uint expansionFactor) override {
      bool mustFail = false;
      if (oldLgSize + expansionFactor > 6 ||
          (oldOffset & ((1 << expansionFactor) - 1)) != 0) {
        // Expansion is not possible because the new size is too large or the offset is not
        // properly-aligned.

        // Unfortunately, Cap'n Proto 0.5.x and prior forgot to "return false" here, instead
        // continuing to execute the rest of the method. In most cases, the method failed later
        // on, causing no harm. But, in cases where the method later succeeded, it probably
        // led to bogus layouts. We cannot simply add the return statement now as this would
        // silently break backwards-compatibility with affected schemas. Instead, we detect the
        // problem and throw an exception.
        //
        // TODO(cleanup): Once sufficient time has elapsed, switch to "return false;" here.
        if (shouldDetectIssue344()) {
          mustFail = true;
        } else {
          return false;
        }
      }

      for (uint i = 0; i < parentDataLocationUsage.size(); i++) {
        auto& location = parent.dataLocations[i];
        if (location.lgSize >= oldLgSize &&
            oldOffset >> (location.lgSize - oldLgSize) == location.offset) {
          // The location we're trying to expand is a subset of this data location.
          auto& usage = parentDataLocationUsage[i];

          // Adjust the offset to be only within this location.
          uint localOldOffset = oldOffset - (location.offset << (location.lgSize - oldLgSize));

          // Try to expand.
          bool result = usage.tryExpand(
              *this, location, oldLgSize, localOldOffset, expansionFactor);
          if (mustFail && result) {
            KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344");
          }
          return result;
        }
      }

      KJ_FAIL_ASSERT("Tried to expand field that was never allocated.");
      return false;
    }